

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Performance::ConditionalCase::~ConditionalCase(ConditionalCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  (this->super_ControlStatementCase).super_ShaderPerformanceCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ConditionalCase_01e3da90;
  iVar1 = (*((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_renderCtx)->
            _vptr_RenderContext[3])();
  if (this->m_arrayBuffer != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_arrayBuffer);
    this->m_arrayBuffer = 0;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->m_comparisonValueArray).super__Vector_base<float,_std::allocator<float>_>);
  deqp::gls::ShaderPerformanceCase::~ShaderPerformanceCase((ShaderPerformanceCase *)this);
  return;
}

Assistant:

ConditionalCase::~ConditionalCase (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if (m_arrayBuffer != 0)
	{
		gl.deleteBuffers(1, &m_arrayBuffer);
		m_arrayBuffer = 0;
	}
}